

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O0

void re2c::BitMap::gen(OutputFile *o,uint32_t ind,uint32_t lb,uint32_t ub)

{
  OutputFile *pOVar1;
  opt_t *poVar2;
  ulong uVar3;
  uint *puVar4;
  uint local_54;
  uint local_50;
  uint32_t j;
  uint32_t local_48;
  uint32_t m;
  uint32_t t;
  uint32_t i;
  uint32_t *bm;
  BitMap *b;
  BitMap *cb;
  uint local_20;
  uint32_t n;
  uint32_t c;
  uint32_t ub_local;
  uint32_t lb_local;
  uint32_t ind_local;
  OutputFile *o_local;
  
  if ((first != (BitMap *)0x0) && ((bUsedYYBitmap & 1) != 0)) {
    n = ub;
    c = lb;
    ub_local = ind;
    _lb_local = o;
    pOVar1 = OutputFile::wind(o,ind);
    pOVar1 = OutputFile::ws(pOVar1,"static const unsigned char ");
    poVar2 = Opt::operator->((Opt *)&opts);
    pOVar1 = OutputFile::wstring(pOVar1,&poVar2->yybm);
    OutputFile::ws(pOVar1,"[] = {");
    local_20 = 1;
    cb._4_4_ = n - c;
    b = first;
    while (b = b->next, b != (BitMap *)0x0) {
      local_20 = local_20 + 1;
    }
    bm = (uint32_t *)first;
    uVar3 = SUB168(ZEXT416(cb._4_4_) * ZEXT816(4),0);
    if (SUB168(ZEXT416(cb._4_4_) * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    _t = (uint32_t *)operator_new__(uVar3);
    m = 0;
    local_48 = 1;
    while (bm != (uint32_t *)0x0) {
      memset(_t,0,(ulong)cb._4_4_ << 2);
      j = 0x80;
      for (; bm != (uint32_t *)0x0 && j != 0; bm = *(uint32_t **)(bm + 4)) {
        bm[6] = m;
        bm[7] = j;
        doGen(*(Go **)bm,*(State **)(bm + 2),_t,c,j);
        j = j >> 1;
      }
      if (8 < local_20) {
        pOVar1 = OutputFile::ws(_lb_local,"\n");
        pOVar1 = OutputFile::wind(pOVar1,ub_local + 1);
        pOVar1 = OutputFile::ws(pOVar1,"/* table ");
        pOVar1 = OutputFile::wu32(pOVar1,local_48);
        pOVar1 = OutputFile::ws(pOVar1," .. ");
        local_50 = local_48 + 7;
        puVar4 = std::min<unsigned_int>(&local_20,&local_50);
        pOVar1 = OutputFile::wu32(pOVar1,*puVar4);
        pOVar1 = OutputFile::ws(pOVar1,": ");
        pOVar1 = OutputFile::wu32(pOVar1,m);
        OutputFile::ws(pOVar1," */");
      }
      for (local_54 = 0; local_54 < cb._4_4_; local_54 = local_54 + 1) {
        if ((local_54 & 7) == 0) {
          pOVar1 = OutputFile::ws(_lb_local,"\n");
          OutputFile::wind(pOVar1,ub_local + 1);
        }
        poVar2 = Opt::operator->((Opt *)&opts);
        if ((poVar2->yybmHexTable & 1U) == 0) {
          OutputFile::wu32_width(_lb_local,_t[local_54],3);
        }
        else {
          OutputFile::wu32_hex(_lb_local,_t[local_54]);
        }
        OutputFile::ws(_lb_local,", ");
      }
      m = cb._4_4_ + m;
      local_48 = local_48 + 8;
    }
    pOVar1 = OutputFile::ws(_lb_local,"\n");
    pOVar1 = OutputFile::wind(pOVar1,ub_local);
    OutputFile::ws(pOVar1,"};\n");
    if (_t != (uint32_t *)0x0) {
      operator_delete__(_t);
    }
  }
  return;
}

Assistant:

void BitMap::gen(OutputFile & o, uint32_t ind, uint32_t lb, uint32_t ub)
{
	if (first && bUsedYYBitmap)
	{
		o.wind(ind).ws("static const unsigned char ").wstring(opts->yybm).ws("[] = {");

		uint32_t c = 1, n = ub - lb;
		const BitMap *cb = first;

		while((cb = cb->next) != NULL) {
			++c;
		}
		BitMap *b = first;

		uint32_t *bm = new uint32_t[n];
		
		for (uint32_t i = 0, t = 1; b; i += n, t += 8)
		{
			memset(bm, 0, n * sizeof(uint32_t));

			for (uint32_t m = 0x80; b && m; m >>= 1)
			{
				b->i = i;
				b->m = m;
				doGen(b->go, b->on, bm, lb, m);
				b = const_cast<BitMap*>(b->next);
			}

			if (c > 8)
			{
				o.ws("\n").wind(ind+1).ws("/* table ").wu32(t).ws(" .. ").wu32(std::min(c, t+7)).ws(": ").wu32(i).ws(" */");
			}

			for (uint32_t j = 0; j < n; ++j)
			{
				if (j % 8 == 0)
				{
					o.ws("\n").wind(ind+1);
				}

				if (opts->yybmHexTable)
				{
					o.wu32_hex(bm[j]);
				}
				else
				{
					o.wu32_width(bm[j], 3);
				}
				o.ws(", ");
			}
		}

		o.ws("\n").wind(ind).ws("};\n");
		
		delete[] bm;
	}
}